

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd_compress.c
# Opt level: O0

int ZSTD_shouldAttachDict(ZSTD_CDict *cdict,ZSTD_CCtx_params params,U64 pledgedSrcSize)

{
  byte local_29;
  size_t cutoff;
  U64 pledgedSrcSize_local;
  ZSTD_CDict *cdict_local;
  
  if ((((pledgedSrcSize <= attachDictSizeCutoffs[(cdict->matchState).cParams.strategy]) ||
       (pledgedSrcSize == 0xffffffffffffffff)) ||
      (local_29 = 0, params.attachDictPref == ZSTD_dictForceAttach)) &&
     (local_29 = 0, params.attachDictPref != ZSTD_dictForceCopy)) {
    local_29 = params.forceWindow != 0 ^ 0xff;
  }
  return (int)(local_29 & 1);
}

Assistant:

static int ZSTD_shouldAttachDict(const ZSTD_CDict* cdict,
                                 ZSTD_CCtx_params params,
                                 U64 pledgedSrcSize)
{
    size_t cutoff = attachDictSizeCutoffs[cdict->matchState.cParams.strategy];
    return ( pledgedSrcSize <= cutoff
          || pledgedSrcSize == ZSTD_CONTENTSIZE_UNKNOWN
          || params.attachDictPref == ZSTD_dictForceAttach )
        && params.attachDictPref != ZSTD_dictForceCopy
        && !params.forceWindow; /* dictMatchState isn't correctly
                                 * handled in _enforceMaxDist */
}